

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_functype_t::wasm_functype_t
          (wasm_functype_t *this,wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  ValueTypes local_60;
  ValueTypes local_48;
  undefined1 local_30 [8];
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_28;
  wasm_valtype_vec_t *local_20;
  wasm_valtype_vec_t *results_local;
  wasm_valtype_vec_t *params_local;
  wasm_functype_t *this_local;
  
  local_20 = results;
  results_local = params;
  params_local = (wasm_valtype_vec_t *)this;
  ToWabtValueTypes(&local_48,params);
  ToWabtValueTypes(&local_60,local_20);
  std::
  make_unique<wabt::interp::FuncType,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_30,&local_48);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::FuncType,std::default_delete<wabt::interp::FuncType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             &local_28,
             (unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> *)
             local_30);
  wasm_externtype_t::wasm_externtype_t(&this->super_wasm_externtype_t,&local_28);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_28);
  std::unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_>::~unique_ptr
            ((unique_ptr<wabt::interp::FuncType,_std::default_delete<wabt::interp::FuncType>_> *)
             local_30);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_60);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_48);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_0043ebd0;
  (this->params).size = results_local->size;
  (this->params).data = results_local->data;
  (this->results).size = local_20->size;
  (this->results).data = local_20->data;
  return;
}

Assistant:

wasm_functype_t(own wasm_valtype_vec_t* params,
                  own wasm_valtype_vec_t* results)
      : wasm_externtype_t{std::make_unique<FuncType>(
            ToWabtValueTypes(params),
            ToWabtValueTypes(results))},
        params(*params),
        results(*results) {}